

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

EntryType * __thiscall
JsUtil::
BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  EntryType *pEVar1;
  code *AllocFunc;
  size_t byteSize;
  size_t sVar2;
  
  if (size == 0) {
    pEVar1 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::JitArenaAllocator::AllocZero;
    }
    else {
      AllocFunc = Memory::JitArenaAllocator::Alloc;
    }
    byteSize = 0xffffffffffffffff;
    if (-1 < size) {
      byteSize = (long)size * 0x20;
    }
    sVar2 = 0;
    pEVar1 = (EntryType *)
             new__<Memory::JitArenaAllocator>
                       (byteSize,this->alloc,(offset_in_JitArenaAllocator_to_subr)AllocFunc);
    do {
      InductionVariable::InductionVariable
                ((InductionVariable *)
                 ((long)&(pEVar1->
                         super_DefaultHashedEntry<unsigned_int,_InductionVariable,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                         ).super_ImplicitKeyValueEntry<unsigned_int,_InductionVariable>.
                         super_ValueEntry<InductionVariable,_JsUtil::(anonymous_namespace)::ValueEntryData<InductionVariable>_>
                         .super_ValueEntryData<InductionVariable>.value.sym + sVar2));
      sVar2 = sVar2 + 0x20;
    } while ((long)size * 0x20 != sVar2);
  }
  return pEVar1;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }